

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::BlockBasicUnsizedArrayCase::BlockBasicUnsizedArrayCase
          (BlockBasicUnsizedArrayCase *this,Context *context,char *name,char *description,
          VarType *elementType,int arraySize,deUint32 layoutFlags)

{
  TestContext *testCtx;
  RenderContext *renderCtx;
  BufferBlock *this_00;
  VarType local_a8;
  BufferVar local_90;
  BufferBlock *local_40;
  BufferBlock *block;
  VarType *pVStack_30;
  int arraySize_local;
  VarType *elementType_local;
  char *description_local;
  char *name_local;
  Context *context_local;
  BlockBasicUnsizedArrayCase *this_local;
  
  block._4_4_ = arraySize;
  pVStack_30 = elementType;
  elementType_local = (VarType *)description;
  description_local = name;
  name_local = (char *)context;
  context_local = (Context *)this;
  testCtx = Context::getTestContext(context);
  renderCtx = Context::getRenderContext((Context *)name_local);
  SSBOLayoutCase::SSBOLayoutCase
            (&this->super_SSBOLayoutCase,testCtx,renderCtx,description_local,
             (char *)elementType_local,GLSL_VERSION_310_ES,BUFFERMODE_PER_BLOCK);
  (this->super_SSBOLayoutCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BlockBasicUnsizedArrayCase_011c2818;
  this_00 = bb::ShaderInterface::allocBlock(&(this->super_SSBOLayoutCase).m_interface,"Block");
  local_40 = this_00;
  glu::VarType::VarType(&local_a8,pVStack_30,-1);
  bb::BufferVar::BufferVar(&local_90,"var",&local_a8,0x1800);
  bb::BufferBlock::addMember(this_00,&local_90);
  bb::BufferVar::~BufferVar(&local_90);
  glu::VarType::~VarType(&local_a8);
  bb::BufferBlock::setFlags(local_40,layoutFlags);
  bb::BufferBlock::setLastUnsizedArraySize(local_40,0,block._4_4_);
  return;
}

Assistant:

BlockBasicUnsizedArrayCase (Context& context, const char* name, const char* description, const VarType& elementType, int arraySize, deUint32 layoutFlags)
		: SSBOLayoutCase(context.getTestContext(), context.getRenderContext(), name, description, glu::GLSL_VERSION_310_ES, BUFFERMODE_PER_BLOCK)
	{
		BufferBlock& block = m_interface.allocBlock("Block");
		block.addMember(BufferVar("var", VarType(elementType, VarType::UNSIZED_ARRAY), ACCESS_READ|ACCESS_WRITE));
		block.setFlags(layoutFlags);

		block.setLastUnsizedArraySize(0, arraySize);
	}